

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrepFaceField.h
# Opt level: O2

Ref<anurbs::BrepFace> __thiscall anurbs::BrepFaceField<3L>::face(BrepFaceField<3L> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  __shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  Ref<anurbs::BrepFace> RVar1;
  
  std::__shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2> *)this,
             in_RSI);
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  RVar1.m_entry.super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (Ref<anurbs::BrepFace>)
         RVar1.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::BrepFace>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ref<BrepFace> face() const
    {
        return m_face;
    }